

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::
KeyMatcherImpl<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&>
::MatchAndExplain(KeyMatcherImpl<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&>
                  *this,pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *key_value,MatchResultListener *listener)

{
  bool bVar1;
  MatchResultListener *pMVar2;
  string explanation;
  StringMatchResultListener inner_listener;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  MatchResultListener local_1c8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8.stream_ = local_1a8;
  local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_00440030;
  std::__cxx11::stringstream::stringstream(local_1b8);
  bVar1 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::MatchAndExplain(&(this->inner_matcher_).
                             super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                            ,&key_value->first,&local_1c8);
  std::__cxx11::stringbuf::str();
  if (local_1e0 != 0) {
    pMVar2 = MatchResultListener::operator<<
                       (listener,(char (*) [30])"whose first field is a value ");
    if (pMVar2->stream_ != (ostream *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (pMVar2->stream_,(char *)local_1e8,local_1e0);
    }
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_00440030;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return bVar1;
}

Assistant:

bool MatchAndExplain(PairType key_value,
                       MatchResultListener* listener) const override {
    StringMatchResultListener inner_listener;
    const bool match = inner_matcher_.MatchAndExplain(
        pair_getters::First(key_value, Rank1()), &inner_listener);
    const std::string explanation = inner_listener.str();
    if (!explanation.empty()) {
      *listener << "whose first field is a value " << explanation;
    }
    return match;
  }